

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O1

ExprNode * parse(ptrlen expr,char **error_msg,ptrlen *error_loc)

{
  ExprNode *en;
  char *ptr;
  void *pvVar1;
  ParserState local_78;
  
  pvVar1 = expr.ptr;
  local_78.lasttoktext.len = 0;
  local_78.err = (char *)0x0;
  local_78.currtext.ptr = pvVar1;
  local_78.currtext.len = expr.len;
  local_78.lasttoktext.ptr = pvVar1;
  advance(&local_78);
  en = parse_expr(&local_78);
  if ((en != (ExprNode *)0x0) && (local_78.tok != TOK_END)) {
    ptr = dupstr("unexpected text at end of expression");
    pvVar1 = (void *)((long)pvVar1 + expr.len);
    if (pvVar1 < local_78.toktext.ptr) {
      __assert_fail("end >= start",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/misc.h",0xbb,
                    "ptrlen make_ptrlen_startend(const void *, const void *)");
    }
    if (local_78.err == (char *)0x0) {
      local_78.errloc.ptr = local_78.toktext.ptr;
      local_78.err = ptr;
      local_78.errloc.len = (long)pvVar1 - (long)local_78.toktext.ptr;
    }
    else {
      safefree(ptr);
    }
    exprnode_free(en);
    en = (ExprNode *)0x0;
  }
  if (en == (ExprNode *)0x0) {
    if (error_msg == (char **)0x0) {
      safefree(local_78.err);
    }
    else {
      *error_msg = local_78.err;
    }
    if (error_loc != (ptrlen *)0x0) {
      error_loc->ptr = local_78.errloc.ptr;
      error_loc->len = local_78.errloc.len;
    }
    en = (ExprNode *)0x0;
  }
  return en;
}

Assistant:

static ExprNode *parse(ptrlen expr, char **error_msg, ptrlen *error_loc)
{
    ParserState ps[1];
    ps->currtext = expr;
    ps->lasttoktext = make_ptrlen(ps->currtext.ptr, 0);
    ps->err = NULL;
    advance(ps);

    ExprNode *en = parse_expr(ps);
    if (en && ps->tok != TOK_END) {
        error(ps, dupstr("unexpected text at end of expression"),
              make_ptrlen_startend(ps->toktext.ptr, ptrlen_end(expr)));
        exprnode_free(en);
        en = NULL;
    }

    if (!en) {
        if (error_msg)
            *error_msg = ps->err;
        else
            sfree(ps->err);
        if (error_loc)
            *error_loc = ps->errloc;
        return NULL;
    }

    return en;
}